

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS1.cpp
# Opt level: O0

bool __thiscall RTIMULSM9DS1::setAccelCTRL6(RTIMULSM9DS1 *this)

{
  int iVar1;
  uchar ctrl6;
  RTIMULSM9DS1 *this_local;
  
  if ((((this->super_RTIMU).m_settings)->m_LSM9DS1AccelSampleRate < 0) ||
     (6 < ((this->super_RTIMU).m_settings)->m_LSM9DS1AccelSampleRate)) {
    fprintf(_stderr,"Illegal LSM9DS1 accel sample rate code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_LSM9DS1AccelSampleRate);
    this_local._7_1_ = false;
  }
  else {
    iVar1 = ((this->super_RTIMU).m_settings)->m_LSM9DS1AccelSampleRate;
    if ((((this->super_RTIMU).m_settings)->m_LSM9DS1AccelLpf < 0) ||
       (3 < ((this->super_RTIMU).m_settings)->m_LSM9DS1AccelLpf)) {
      fprintf(_stderr,"Illegal LSM9DS1 accel low pass fiter code %d\n",
              (ulong)(uint)((this->super_RTIMU).m_settings)->m_LSM9DS1AccelLpf);
      this_local._7_1_ = false;
    }
    else {
      switch(((this->super_RTIMU).m_settings)->m_LSM9DS1AccelFsr) {
      case 0:
        this->m_accelScale = 6.1e-05;
        break;
      case 1:
        this->m_accelScale = 0.000732;
        break;
      case 2:
        this->m_accelScale = 0.000122;
        break;
      case 3:
        this->m_accelScale = 0.000244;
        break;
      default:
        fprintf(_stderr,"Illegal LSM9DS1 accel FSR code %d\n",
                (ulong)(uint)((this->super_RTIMU).m_settings)->m_LSM9DS1AccelFsr);
        return false;
      }
      this_local._7_1_ =
           RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                              this->m_accelGyroSlaveAddr,' ',
                              (byte)(iVar1 << 5) |
                              (byte)((this->super_RTIMU).m_settings)->m_LSM9DS1AccelLpf |
                              (byte)(((this->super_RTIMU).m_settings)->m_LSM9DS1AccelFsr << 3),
                              "Failed to set LSM9DS1 accel CTRL6");
    }
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMULSM9DS1::setAccelCTRL6()
{
    unsigned char ctrl6;

    if ((m_settings->m_LSM9DS1AccelSampleRate < 0) || (m_settings->m_LSM9DS1AccelSampleRate > 6)) {
        HAL_ERROR1("Illegal LSM9DS1 accel sample rate code %d\n", m_settings->m_LSM9DS1AccelSampleRate);
        return false;
    }

    ctrl6 = (m_settings->m_LSM9DS1AccelSampleRate << 5);

    if ((m_settings->m_LSM9DS1AccelLpf < 0) || (m_settings->m_LSM9DS1AccelLpf > 3)) {
        HAL_ERROR1("Illegal LSM9DS1 accel low pass fiter code %d\n", m_settings->m_LSM9DS1AccelLpf);
        return false;
    }

    switch (m_settings->m_LSM9DS1AccelFsr) {
    case LSM9DS1_ACCEL_FSR_2:
        m_accelScale = (RTFLOAT)0.000061;
        break;

    case LSM9DS1_ACCEL_FSR_4:
        m_accelScale = (RTFLOAT)0.000122;
        break;

    case LSM9DS1_ACCEL_FSR_8:
        m_accelScale = (RTFLOAT)0.000244;
        break;

    case LSM9DS1_ACCEL_FSR_16:
        m_accelScale = (RTFLOAT)0.000732;
        break;

    default:
        HAL_ERROR1("Illegal LSM9DS1 accel FSR code %d\n", m_settings->m_LSM9DS1AccelFsr);
        return false;
    }

    ctrl6 |= (m_settings->m_LSM9DS1AccelLpf) | (m_settings->m_LSM9DS1AccelFsr << 3);

    return m_settings->HALWrite(m_accelGyroSlaveAddr,  LSM9DS1_CTRL6, ctrl6, "Failed to set LSM9DS1 accel CTRL6");
}